

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode::SectionNode
          (SectionNode *this,SectionStats *_stats)

{
  SectionStats *in_RSI;
  SectionStats *in_RDI;
  
  in_RDI->_vptr_SectionStats = (_func_int **)&PTR__SectionNode_003379c8;
  SectionStats::SectionStats(in_RSI,in_RDI);
  clara::std::
  vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
  ::vector((vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
            *)0x28ece3);
  clara::std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>::vector
            ((vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_> *)0x28ecf3);
  std::__cxx11::string::string((string *)in_RDI[1].sectionInfo.description.field_2._M_local_buf);
  std::__cxx11::string::string((string *)&in_RDI[1].assertions);
  return;
}

Assistant:

explicit SectionNode(SectionStats const& _stats) : stats(_stats) {}